

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall Parser::createAccessConstructorNode(Parser *this,Token *t)

{
  Node *this_00;
  
  this_00 = (Node *)operator_new(0x30);
  Node::Node(this_00,this->ctx,t);
  this_00->nodeType = PNT_ACCESS_CONSTRUCTOR;
  return this_00;
}

Assistant:

Node * createAccessConstructorNode(Token & t)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_ACCESS_CONSTRUCTOR;
    return n;
  }